

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

void __thiscall
irr::scene::CSceneManager::CSceneManager
          (CSceneManager *this,IVideoDriver *driver,ICursorControl *cursorControl,IMeshCache *cache)

{
  void *__s;
  ISceneManager *smanager;
  CSceneCollisionManager *this_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ISceneManager *in_RDI;
  vector3df *position;
  CB3DMeshFileLoader *this_01;
  ISceneManager *in_stack_ffffffffffffff48;
  ISceneNode *in_stack_ffffffffffffff50;
  void **in_stack_ffffffffffffff58;
  ISceneNode *in_stack_ffffffffffffff60;
  vector3df *in_stack_ffffffffffffff70;
  vector3df *in_stack_ffffffffffffff78;
  undefined1 local_44 [24];
  vector3d<float> local_2c [3];
  
  local_2c[1]._0_8_ = in_RCX;
  local_2c._20_8_ = in_RDX;
  local_2c[2]._4_8_ = in_RSI;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x12));
  ISceneManager::ISceneManager(in_RDI,&PTR_construction_vtable_24__0043a540);
  core::vector3d<float>::vector3d(local_2c,0.0,0.0,0.0);
  core::vector3d<float>::vector3d((vector3d<float> *)(local_44 + 0xc),0.0,0.0,0.0);
  core::vector3d<float>::vector3d((vector3d<float> *)local_44,1.0,1.0,1.0);
  position = (vector3df *)(local_44 + 0xc);
  this_01 = (CB3DMeshFileLoader *)local_44;
  ISceneNode::ISceneNode
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,(s32)((ulong)this_01 >> 0x20),position,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  in_RDI->_vptr_ISceneManager = (_func_int **)0x43a288;
  in_RDI[0x12]._vptr_ISceneManager = (_func_int **)0x43a528;
  *(undefined8 *)&in_RDI->field_0x8 = 0x43a3f0;
  *(float *)&in_RDI[7].field_0x8 = local_2c[2].Y;
  *(float *)&in_RDI[7].field_0xc = local_2c[2].Z;
  *(float *)&in_RDI[7].field_0x10 = local_2c[1].Z;
  *(float *)&in_RDI[7].field_0x14 = local_2c[2].X;
  core::array<irr::scene::ISceneNode_*>::array((array<irr::scene::ISceneNode_*> *)this_01);
  core::array<irr::scene::ISceneNode_*>::array((array<irr::scene::ISceneNode_*> *)this_01);
  core::array<irr::scene::CSceneManager::DefaultNodeEntry>::array
            ((array<irr::scene::CSceneManager::DefaultNodeEntry> *)this_01);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::array
            ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)this_01);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::array
            ((array<irr::scene::CSceneManager::TransparentNodeEntry> *)this_01);
  core::array<irr::scene::ISceneNode_*>::array((array<irr::scene::ISceneNode_*> *)this_01);
  core::array<irr::scene::IMeshLoader_*>::array((array<irr::scene::IMeshLoader_*> *)this_01);
  core::array<irr::scene::ISceneNode_*>::array((array<irr::scene::ISceneNode_*> *)this_01);
  in_RDI[0x10]._vptr_ISceneManager = (_func_int **)0x0;
  core::vector3d<float>::vector3d((vector3d<float> *)&in_RDI[0x10].field_0x8);
  video::SColor::SColor((SColor *)&in_RDI[0x10].field_0x14,0x96,0,0,0);
  video::SColorf::SColorf((SColorf *)&in_RDI[0x10].field_0x18,0.0,0.0,0.0,0.0);
  *(undefined8 *)&in_RDI[0x11].field_0x8 = 0;
  *(float *)&in_RDI[0x11].field_0x10 = local_2c[1].X;
  *(float *)&in_RDI[0x11].field_0x14 = local_2c[1].Y;
  *(undefined4 *)&in_RDI[0x11].field_0x18 = 0;
  *(ISceneManager **)&in_RDI[6].field_0x10 = in_RDI;
  if (*(long *)&in_RDI[7].field_0x8 != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI[7].field_0x8 +
               *(long *)(**(long **)&in_RDI[7].field_0x8 + -0x18)));
  }
  if (*(long *)&in_RDI[7].field_0x10 != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI[7].field_0x10 +
               *(long *)(**(long **)&in_RDI[7].field_0x10 + -0x18)));
  }
  if (*(long *)&in_RDI[0x11].field_0x10 == 0) {
    __s = operator_new(0x40);
    memset(__s,0,0x40);
    CMeshCache::CMeshCache((CMeshCache *)this_01);
    *(void **)&in_RDI[0x11].field_0x10 = __s;
  }
  else {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI[0x11].field_0x10 +
               *(long *)(**(long **)&in_RDI[0x11].field_0x10 + -0x18)));
  }
  smanager = (ISceneManager *)operator_new(0x48);
  irr::io::CAttributes::CAttributes((CAttributes *)this_01,(IVideoDriver *)position);
  *(ISceneManager **)&in_RDI[0x11].field_0x8 = smanager;
  this_00 = (CSceneCollisionManager *)operator_new(0x30);
  CSceneCollisionManager::CSceneCollisionManager(this_00,smanager,(IVideoDriver *)this_01);
  *(CSceneCollisionManager **)&in_RDI[7].field_0x18 = this_00;
  operator_new(0xa8);
  CXMeshFileLoader::CXMeshFileLoader((CXMeshFileLoader *)this_01,(ISceneManager *)position);
  core::array<irr::scene::IMeshLoader_*>::push_back
            ((array<irr::scene::IMeshLoader_*> *)this_01,(IMeshLoader **)position);
  operator_new(0x48);
  COBJMeshFileLoader::COBJMeshFileLoader((COBJMeshFileLoader *)this_01,(ISceneManager *)position);
  core::array<irr::scene::IMeshLoader_*>::push_back
            ((array<irr::scene::IMeshLoader_*> *)this_01,(IMeshLoader **)position);
  operator_new(0xf8);
  CB3DMeshFileLoader::CB3DMeshFileLoader(this_01,(ISceneManager *)position);
  core::array<irr::scene::IMeshLoader_*>::push_back
            ((array<irr::scene::IMeshLoader_*> *)this_01,(IMeshLoader **)position);
  return;
}

Assistant:

CSceneManager::CSceneManager(video::IVideoDriver *driver,
		gui::ICursorControl *cursorControl, IMeshCache *cache) :
		ISceneNode(0, 0),
		Driver(driver),
		CursorControl(cursorControl),
		ActiveCamera(0), ShadowColor(150, 0, 0, 0), AmbientLight(0, 0, 0, 0), Parameters(0),
		MeshCache(cache), CurrentRenderPass(ESNRP_NONE)
{
#ifdef _DEBUG
	ISceneManager::setDebugName("CSceneManager ISceneManager");
	ISceneNode::setDebugName("CSceneManager ISceneNode");
#endif

	// root node's scene manager
	SceneManager = this;

	if (Driver)
		Driver->grab();

	if (CursorControl)
		CursorControl->grab();

	// create mesh cache if not there already
	if (!MeshCache)
		MeshCache = new CMeshCache();
	else
		MeshCache->grab();

	// set scene parameters
	Parameters = new io::CAttributes();

	// create collision manager
	CollisionManager = new CSceneCollisionManager(this, Driver);

	// add file format loaders. add the least commonly used ones first,
	// as these are checked last

	// TODO: now that we have multiple scene managers, these should be
	// shallow copies from the previous manager if there is one.

	MeshLoaderList.push_back(new CXMeshFileLoader(this));
	MeshLoaderList.push_back(new COBJMeshFileLoader(this));
	MeshLoaderList.push_back(new CB3DMeshFileLoader(this));
}